

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O1

void ts_range_array_add(TSRangeArray *self,Length start,Length end)

{
  uint uVar1;
  uint uVar2;
  size_t __nmemb;
  TSRange *pTVar3;
  size_t extraout_RAX;
  uint uVar4;
  uint uVar5;
  
  uVar5 = start.bytes;
  uVar4 = end.bytes;
  if (self->size == 0) {
    if (uVar4 <= uVar5) {
      return;
    }
  }
  else {
    uVar2 = self->size - 1;
    pTVar3 = self->contents;
    uVar1 = pTVar3[uVar2].end_byte;
    if (uVar5 <= uVar1) {
      pTVar3[uVar2].end_byte = uVar4;
      pTVar3[uVar2].end_point.row = end.extent.row;
      pTVar3[uVar2].end_point.column = end.extent.column;
    }
    if (uVar5 <= uVar1 || uVar4 <= uVar5) {
      return;
    }
  }
  uVar1 = self->capacity;
  if (self->size != uVar1) goto LAB_00127343;
  uVar2 = 8;
  if (8 < uVar1 * 2) {
    uVar2 = uVar1 * 2;
  }
  if (uVar2 <= uVar1) goto LAB_00127343;
  __nmemb = (size_t)uVar2;
  if (self->contents == (TSRange *)0x0) {
LAB_0012731f:
    pTVar3 = (TSRange *)calloc(__nmemb,0x18);
    if (pTVar3 == (TSRange *)0x0) {
      ts_range_array_add_cold_2();
      if (*(int *)(__nmemb + 0x10) == 0) {
        __assert_fail("(uint32_t)(&self->cursor.stack)->size - 1 < (&self->cursor.stack)->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/get_changed_ranges.c"
                      ,0x7e,"Length iterator_start_position(Iterator *)");
      }
      return;
    }
  }
  else {
    pTVar3 = (TSRange *)realloc(self->contents,__nmemb * 0x18);
    if (pTVar3 == (TSRange *)0x0) {
      ts_range_array_add_cold_1();
      __nmemb = extraout_RAX;
      goto LAB_0012731f;
    }
  }
  self->contents = pTVar3;
  self->capacity = uVar2;
LAB_00127343:
  pTVar3 = self->contents;
  uVar1 = self->size;
  self->size = uVar1 + 1;
  pTVar3[uVar1].start_point.row = start.extent.row;
  pTVar3[uVar1].start_point.column = start.extent.column;
  pTVar3[uVar1].end_point.row = end.extent.row;
  pTVar3[uVar1].end_point.column = end.extent.column;
  pTVar3[uVar1].start_byte = uVar5;
  pTVar3[uVar1].end_byte = uVar4;
  return;
}

Assistant:

static void ts_range_array_add(TSRangeArray *self, Length start, Length end) {
  if (self->size > 0) {
    TSRange *last_range = array_back(self);
    if (start.bytes <= last_range->end_byte) {
      last_range->end_byte = end.bytes;
      last_range->end_point = end.extent;
      return;
    }
  }

  if (start.bytes < end.bytes) {
    TSRange range = { start.extent, end.extent, start.bytes, end.bytes };
    array_push(self, range);
  }
}